

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.cpp
# Opt level: O0

void __thiscall BamTools::SamProgram::SamProgram(SamProgram *this,string *id)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::string::string(in_RDI + 0x80);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::vector
            ((vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             0x2877f8);
  std::__cxx11::string::string(in_RDI + 0xb8);
  return;
}

Assistant:

SamProgram::SamProgram(const std::string& id)
    : ID(id)
{}